

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O2

int Gia_ManAreCubeCheckList(Gia_ManAre_t *p,Gia_PtrAre_t *pRoot,Gia_StaAre_t *pSta)

{
  Gia_PtrAre_t GVar1;
  int iVar2;
  int iVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  uint **ppuVar7;
  Gia_StaAre_t *p2;
  bool bVar8;
  
  ppuVar7 = p->ppStas;
  p2 = (Gia_StaAre_t *)
       ((long)p->nSize * (ulong)((uint)*pRoot & 0xfffff) * 4 +
       *(long *)((long)ppuVar7 + (ulong)((uint)*pRoot >> 0x11 & 0x3ff8)));
  do {
    if ((Gia_StaAre_t *)*ppuVar7 == p2) {
      return 1;
    }
    p->nChecks = p->nChecks + 1;
    GVar1 = p2->iPrev;
    if (-1 < (int)GVar1) {
      iVar3 = p->nWords;
      iVar2 = Gia_StaAreDisjoint(pSta,p2,iVar3);
      if (iVar2 == 0) {
        iVar2 = Gia_StaAreContain(p2,pSta,iVar3);
        if (iVar2 != 0) {
          Gia_ManAreRycycleSta(p,pSta);
          return 0;
        }
        iVar2 = Gia_StaAreContain(pSta,p2,iVar3);
        if (iVar2 == 0) {
          iVar3 = Gia_StaAreSharpVar(pSta,p2,iVar3);
          if (iVar3 != -1) {
            iVar2 = iVar3 * 2 >> 5;
            GVar1 = (&pSta[1].iPrev)[iVar2];
            uVar5 = iVar3 * 2 & 0x1e;
            bVar4 = (byte)uVar5;
            if ((((uint)GVar1 >> uVar5 & 1) != 0) ||
               (uVar6 = 2 << bVar4, ((uint)GVar1 & uVar6) != 0)) {
              __assert_fail("!Gia_StaHasValue0(pSta, iVar) && !Gia_StaHasValue1(pSta, iVar)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEra2.c"
                            ,0x3fa,
                            "int Gia_ManAreCubeCheckList(Gia_ManAre_t *, Gia_PtrAre_t *, Gia_StaAre_t *)"
                           );
            }
            bVar8 = ((uint)(&p2[1].iPrev)[iVar2] >> uVar5 & 1) != 0;
            if (bVar8 == (((uint)(&p2[1].iPrev)[iVar2] >> (bVar4 | 1) & 1) != 0)) {
              __assert_fail("Gia_StaHasValue0(pCube, iVar) ^ Gia_StaHasValue1(pCube, iVar)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEra2.c"
                            ,0x3fb,
                            "int Gia_ManAreCubeCheckList(Gia_ManAre_t *, Gia_PtrAre_t *, Gia_StaAre_t *)"
                           );
            }
            if (!bVar8) {
              uVar6 = 1 << bVar4;
            }
            (&pSta[1].iPrev)[iVar2] = (Gia_PtrAre_t)((uint)GVar1 | uVar6);
          }
        }
        else {
          p2->iPrev = (Gia_PtrAre_t)((uint)GVar1 | 0x80000000);
          ppuVar7 = p->ppStas;
        }
      }
    }
    p2 = Gia_StaNext(p,p2);
  } while( true );
}

Assistant:

static inline int Gia_ManAreCubeCheckList( Gia_ManAre_t * p, Gia_PtrAre_t * pRoot, Gia_StaAre_t * pSta )
{
    int fVerbose = 0;
    Gia_StaAre_t * pCube;
    int iVar;
if ( fVerbose )
{
printf( "Trying cube: " );
Gia_ManArePrintCube( p, pSta );
}
    Gia_ManAreForEachCubeList( p, Gia_ManAreSta(p, *pRoot), pCube )
    {
        p->nChecks++;
        if ( Gia_StaIsUnused( pCube ) )
            continue;
        if ( Gia_StaAreDisjoint( pSta, pCube, p->nWords ) )
            continue;
        if ( Gia_StaAreContain( pCube, pSta, p->nWords ) )
        {
if ( fVerbose )
{
printf( "Contained in " );
Gia_ManArePrintCube( p, pCube );
}
            Gia_ManAreRycycleSta( p, pSta );
            return 0;
        }
        if ( Gia_StaAreContain( pSta, pCube, p->nWords ) )
        {
if ( fVerbose )
{
printf( "Contains     " );
Gia_ManArePrintCube( p, pCube );
}
            Gia_StaSetUnused( pCube );
            continue;
        }
        iVar = Gia_StaAreSharpVar( pSta, pCube, p->nWords );
        if ( iVar == -1 )
            continue;
if ( fVerbose )
{
printf( "Sharped by   " );
Gia_ManArePrintCube( p, pCube );
Gia_ManArePrintCube( p, pSta );
}
//        printf( "%d  %d\n", Gia_StaAreDashNum( pSta, pCube, p->nWords ), Gia_StaAreSharpVar( pSta, pCube, p->nWords ) );
        assert( !Gia_StaHasValue0(pSta, iVar) && !Gia_StaHasValue1(pSta, iVar) );
        assert(  Gia_StaHasValue0(pCube, iVar) ^  Gia_StaHasValue1(pCube, iVar) );
        if ( Gia_StaHasValue0(pCube, iVar) )
            Gia_StaSetValue1( pSta, iVar );
        else
            Gia_StaSetValue0( pSta, iVar );
//        return Gia_ManAreCubeCheckList( p, pRoot, pSta );
    }
    return 1;
}